

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O1

void uv__signal_close(uv_signal_t *handle)

{
  uv__signal_stop(handle);
  if (handle->caught_signals == handle->dispatched_signals) {
    uv__make_close_pending((uv_handle_t *)handle);
    return;
  }
  return;
}

Assistant:

void uv__signal_close(uv_signal_t* handle) {

  uv__signal_stop(handle);

  /* If there are any caught signals "trapped" in the signal pipe, we can't
   * call the close callback yet. Otherwise, add the handle to the finish_close
   * queue.
   */
  if (handle->caught_signals == handle->dispatched_signals) {
    uv__make_close_pending((uv_handle_t*) handle);
  }
}